

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O1

duckdb_state duckdb_query(duckdb_connection connection,char *query,duckdb_result *out)

{
  duckdb_state dVar1;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  allocator local_41;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_40;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__cxx11::string::string((string *)&local_30,query,&local_41);
  duckdb::Connection::Query((Connection *)local_38,(string *)connection);
  if (local_30._M_pi != &local_20) {
    operator_delete(local_30._M_pi);
  }
  local_40._M_head_impl = (QueryResult *)local_38;
  local_38 = (undefined1  [8])0x0;
  dVar1 = duckdb::DuckDBTranslateResult
                    ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)&local_40,out);
  if ((element_type *)local_40._M_head_impl != (element_type *)0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&((((weak_ptr<duckdb::ClientContext,_true> *)
                        &((local_40._M_head_impl)->super_BaseQueryResult)._vptr_BaseQueryResult)->
                       internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_enable_shared_from_this<duckdb::ClientContext> + 8))->_M_pi)()
    ;
  }
  local_40._M_head_impl = (QueryResult *)0x0;
  if (local_38 != (undefined1  [8])0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((((enable_shared_from_this<duckdb::ClientContext> *)local_38)->__weak_this_)
                        .internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->
              _M_pi)();
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_query(duckdb_connection connection, const char *query, duckdb_result *out) {
	Connection *conn = reinterpret_cast<Connection *>(connection);
	auto result = conn->Query(query);
	return DuckDBTranslateResult(std::move(result), out);
}